

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int streamParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  xmlTextReaderPtr reader;
  int in_R9D;
  
  reader = (xmlTextReaderPtr)xmlReaderForFile(filename,0,options);
  iVar1 = streamProcessTest(filename,result,err,reader,(char *)0x0,in_R9D);
  xmlFreeTextReader(reader);
  return iVar1;
}

Assistant:

static int
streamParseTest(const char *filename, const char *result, const char *err,
                int options) {
    xmlTextReaderPtr reader;
    int ret;

    reader = xmlReaderForFile(filename, NULL, options);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    xmlFreeTextReader(reader);
    return(ret);
}